

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImGuiWindow * GetCombinedRootWindow(ImGuiWindow *window,bool popup_hierarchy)

{
  ImGuiWindow *pIVar1;
  ImGuiWindow *pIVar2;
  
  pIVar1 = (ImGuiWindow *)0x0;
  while (pIVar2 = window, pIVar1 != pIVar2) {
    pIVar1 = pIVar2;
    window = pIVar2->RootWindow;
    if (popup_hierarchy) {
      window = pIVar2->RootWindow->RootWindowPopupTree;
    }
  }
  return pIVar2;
}

Assistant:

static ImGuiWindow* GetCombinedRootWindow(ImGuiWindow* window, bool popup_hierarchy)
{
    ImGuiWindow* last_window = NULL;
    while (last_window != window)
    {
        last_window = window;
        window = window->RootWindow;
        if (popup_hierarchy)
            window = window->RootWindowPopupTree;
    }
    return window;
}